

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall
spirv_cross::SPIRExpression::SPIRExpression
          (SPIRExpression *this,string *expr,TypeID expression_type_,bool immutable_)

{
  *(undefined8 *)&(this->super_IVariant).self = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRExpression_0043c310;
  ::std::__cxx11::string::string((string *)&this->expression,(string *)expr);
  (this->expression_type).id = expression_type_.id;
  (this->loaded_from).id = 0;
  this->immutable = immutable_;
  this->need_transpose = false;
  this->access_chain = false;
  (this->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  (this->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
       = (TypedID<(spirv_cross::Types)0> *)&(this->expression_dependencies).stack_storage;
  (this->expression_dependencies).buffer_capacity = 8;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)&(this->implied_read_expressions).stack_storage;
  (this->implied_read_expressions).buffer_capacity = 8;
  this->emitted_loop_level = 0;
  return;
}

Assistant:

SPIRExpression(std::string expr, TypeID expression_type_, bool immutable_)
	    : expression(std::move(expr))
	    , expression_type(expression_type_)
	    , immutable(immutable_)
	{
	}